

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridFourier.cpp
# Opt level: O3

void __thiscall
TasGrid::GridFourier::getInterpolationWeights(GridFourier *this,double *x,double *weights)

{
  long *plVar1;
  int *piVar2;
  pointer pcVar3;
  pointer pcVar4;
  complex<double> *__z;
  size_t sVar5;
  pointer piVar6;
  double *pdVar7;
  bool bVar8;
  double dVar9;
  undefined8 uVar10;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __result;
  int *piVar11;
  pointer piVar12;
  long lVar13;
  uint uVar14;
  int *piVar15;
  long lVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  size_type __n;
  long lVar20;
  double *pdVar21;
  GridFourier *pGVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  MultiIndexSet *pMVar26;
  double dVar27;
  vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  numerator_cache;
  complex<double> step;
  vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  expcache;
  vector<int,_std::allocator<int>_> p;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  index_map;
  double local_130;
  undefined1 local_118 [16];
  vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  local_108;
  vector<int,_std::allocator<int>_> local_f0;
  long local_d8;
  GridFourier *local_d0;
  double *local_c8;
  uint local_c0;
  uint local_bc;
  vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  local_b8;
  long local_a0;
  int *local_98 [2];
  long local_88;
  double *local_80;
  MultiIndexSet *local_78;
  double local_70;
  double local_68;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_60;
  undefined4 local_48;
  uint uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  pMVar26 = &(this->super_BaseCanonicalGrid).points;
  if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pMVar26 = &(this->super_BaseCanonicalGrid).needed;
  }
  local_c8 = x;
  generateIndexingMap(&local_60,this);
  local_78 = pMVar26;
  if (0 < (long)pMVar26->cache_num_indexes) {
    memset(weights,0,(long)pMVar26->cache_num_indexes << 3);
  }
  piVar11 = (this->active_tensors).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar2 = (this->active_tensors).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar11 == piVar2) {
    iVar17 = 0;
  }
  else {
    piVar15 = piVar11 + 1;
    if (piVar15 != piVar2) {
      iVar17 = *piVar11;
      do {
        iVar25 = *piVar15;
        iVar19 = iVar17;
        if (iVar17 <= iVar25) {
          iVar19 = iVar25;
        }
        if (iVar17 < iVar25) {
          piVar11 = piVar15;
        }
        piVar15 = piVar15 + 1;
        iVar17 = iVar19;
      } while (piVar15 != piVar2);
    }
    iVar17 = *piVar11;
  }
  local_d0 = this;
  local_80 = weights;
  ::std::
  vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  ::vector(&local_b8,(long)(int)(iVar17 + 1U),(allocator_type *)&local_108);
  if (-1 < iVar17) {
    uVar23 = 0;
    do {
      iVar25 = (local_d0->wrapper).num_points.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar23];
      ::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
                (local_b8.
                 super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar23,(long)iVar25);
      pcVar3 = local_b8.
               super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar23].
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)pcVar3->_M_value = 0x3ff0000000000000;
      *(undefined8 *)(pcVar3->_M_value + 8) = 0;
      piVar12 = (pointer)cos(-6.283185307179586 / (double)iVar25);
      local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)sin(-6.283185307179586 / (double)iVar25);
      local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = piVar12;
      if (1 < iVar25) {
        lVar16 = 0;
        do {
          plVar1 = (long *)((local_b8.
                             super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar23].
                             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_value + lVar16);
          local_108.
          super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar1;
          local_108.
          super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar1[1];
          ::std::complex<double>::operator*=
                    ((complex<double> *)&local_108,(complex<double> *)&local_f0);
          plVar1 = (long *)(local_b8.
                            super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar23].
                            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1]._M_value + lVar16);
          *plVar1 = (long)local_108.
                          super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
          plVar1[1] = (long)local_108.
                            super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
          lVar16 = lVar16 + 0x10;
        } while ((long)iVar25 * 0x10 + -0x10 != lVar16);
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 != iVar17 + 1U);
  }
  pGVar22 = local_d0;
  ::std::
  vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  ::vector(&local_108,(long)(local_d0->super_BaseCanonicalGrid).num_dimensions,
           (allocator_type *)&local_f0);
  if (0 < (pGVar22->super_BaseCanonicalGrid).num_dimensions) {
    piVar12 = (pGVar22->max_levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar16 = 0;
    do {
      ::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
                (local_108.
                 super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar16,(long)piVar12[lVar16] + 1);
      dVar27 = local_c8[lVar16];
      dVar9 = cos(dVar27 * 6.283185307179586);
      dVar27 = sin(dVar27 * 6.283185307179586);
      pcVar3 = local_108.
               super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar16].
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      *(double *)pcVar3->_M_value = dVar9;
      *(double *)(pcVar3->_M_value + 8) = dVar27;
      piVar12 = (pGVar22->max_levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (0 < piVar12[lVar16]) {
        lVar20 = 1;
        do {
          pcVar4 = local_108.
                   super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar16].
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pcVar3 = pcVar4 + lVar20 + -1;
          uVar10 = *(undefined8 *)(pcVar3->_M_value + 8);
          pcVar4 = pcVar4 + lVar20;
          *(undefined8 *)pcVar4->_M_value = *(undefined8 *)pcVar3->_M_value;
          *(undefined8 *)(pcVar4->_M_value + 8) = uVar10;
          if (0 < (pGVar22->wrapper).num_points.super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar20 + -1]) {
            iVar17 = 0;
            do {
              __z = local_108.
                    super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar16].
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
              ::std::complex<double>::operator*=(__z + lVar20,__z);
              iVar17 = iVar17 + 1;
            } while (iVar17 < (pGVar22->wrapper).num_points.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar20 + -1]);
          }
          piVar12 = (pGVar22->max_levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          bVar8 = lVar20 < piVar12[lVar16];
          lVar20 = lVar20 + 1;
        } while (bVar8);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < (pGVar22->super_BaseCanonicalGrid).num_dimensions);
  }
  if (0 < (pGVar22->active_tensors).cache_num_indexes) {
    lVar16 = 0;
    local_d8 = 0;
    do {
      sVar5 = (pGVar22->active_tensors).num_dimensions;
      piVar12 = (pGVar22->active_tensors).indexes.super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ::std::vector<int,_std::allocator<int>_>::vector
                (&local_f0,(long)(pGVar22->super_BaseCanonicalGrid).num_dimensions,
                 (allocator_type *)local_98);
      __n = (size_type)(pGVar22->super_BaseCanonicalGrid).num_dimensions;
      if ((long)__n < 1) {
        uVar18 = 1;
      }
      else {
        piVar6 = (pGVar22->wrapper).num_points.super__Vector_base<int,_std::allocator<int>_>._M_impl
                 .super__Vector_impl_data._M_start;
        uVar18 = 1;
        lVar20 = 0;
        do {
          iVar17 = piVar6[*(int *)((long)piVar12 + lVar20 * 4 + sVar5 * lVar16)];
          local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar20] = iVar17;
          uVar18 = uVar18 * iVar17;
          lVar20 = lVar20 + 1;
          __n = (size_type)(pGVar22->super_BaseCanonicalGrid).num_dimensions;
        } while (lVar20 < (long)__n);
      }
      local_a0 = lVar16;
      ::std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_98,__n,(allocator_type *)local_118);
      if (0 < (int)uVar18) {
        local_70 = (double)(pGVar22->active_w).super__Vector_base<int,_std::allocator<int>_>._M_impl
                           .super__Vector_impl_data._M_start[local_d8] / (double)(int)uVar18;
        lVar16 = sVar5 * local_a0;
        uVar14 = 0;
        local_c0 = uVar18;
        do {
          lVar20 = (long)(pGVar22->super_BaseCanonicalGrid).num_dimensions;
          local_bc = uVar14;
          if (lVar20 < 1) {
            local_130 = 1.0;
          }
          else {
            uVar24 = lVar20 + 1;
            local_130 = 1.0;
            uVar23 = (ulong)uVar14;
            lVar20 = lVar20 * 6;
            do {
              iVar17 = local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar24 - 2];
              iVar25 = (int)uVar23 % iVar17;
              pdVar7 = *(double **)
                        ((long)&local_108.
                                super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].
                                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar20 * 4);
              pdVar21 = (double *)(long)iVar25;
              local_118._0_8_ = *pdVar7;
              local_118._8_8_ = pdVar7[1];
              local_c8 = pdVar21;
              ::std::complex<double>::operator*=
                        ((complex<double> *)local_118,
                         local_b8.
                         super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start
                         [*(int *)((long)piVar12 + uVar24 * 4 + lVar16 + -8)].
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + (long)pdVar21);
              if (1e-12 <= ABS(1.0 - (double)local_118._0_8_)) {
                iVar25 = iVar25 * (iVar17 + 1);
                lVar13 = (long)*(int *)((long)piVar12 + uVar24 * 4 + lVar16 + -8);
                pdVar7 = (double *)
                         (*(long *)((long)&local_108.
                                           super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[-1].
                                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar20 * 4) +
                         lVar13 * 0x10);
                local_118._0_8_ = *pdVar7;
                local_118._8_8_ = pdVar7[1];
                ::std::complex<double>::operator*=
                          ((complex<double> *)local_118,
                           local_b8.
                           super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar13].
                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                           (int)(CONCAT44(iVar25 - (iVar25 >> 0x1f) >> 0x1f,iVar25 / 2) %
                                (long)iVar17));
                local_48 = (undefined4)local_118._8_8_;
                local_68 = 1.0 - (double)local_118._0_8_;
                uStack_44 = SUB84(local_118._8_8_,4) ^ 0x80000000;
                uStack_40 = 0;
                uStack_3c = 0x80000000;
                pdVar7 = *(double **)
                          ((long)&local_108.
                                  super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].
                                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar20 * 4);
                local_118._0_8_ = *pdVar7;
                local_118._8_8_ = pdVar7[1];
                ::std::complex<double>::operator*=
                          ((complex<double> *)local_118,
                           local_b8.
                           super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start
                           [*(int *)((long)piVar12 + uVar24 * 4 + lVar16 + -8)].
                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + (long)pdVar21);
                dVar27 = (double)__divdc3(SUB84(local_68,0),local_48,1.0 - (double)local_118._0_8_,
                                          -(double)local_118._8_8_);
                dVar27 = dVar27 + dVar27 + -1.0;
              }
              else {
                dVar27 = (double)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar24 - 2];
              }
              local_130 = local_130 * dVar27;
              local_98[0][uVar24 - 2] =
                   local_60.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start
                   [*(int *)((long)piVar12 + uVar24 * 4 + lVar16 + -8)].
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[(long)local_c8];
              uVar23 = (long)(int)uVar23 /
                       (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar24 - 2] & 0xffffffff;
              uVar24 = uVar24 - 1;
              lVar20 = lVar20 + -6;
            } while (1 < uVar24);
          }
          iVar17 = MultiIndexSet::getSlot(local_78,local_98[0]);
          local_80[iVar17] = local_130 * local_70 + local_80[iVar17];
          uVar14 = local_bc + 1;
          pGVar22 = local_d0;
        } while (uVar14 != local_c0);
      }
      if (local_98[0] != (int *)0x0) {
        operator_delete(local_98[0],local_88 - (long)local_98[0]);
      }
      lVar16 = local_a0;
      if (local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      local_d8 = local_d8 + 1;
      lVar16 = lVar16 + 4;
    } while (local_d8 < (pGVar22->active_tensors).cache_num_indexes);
  }
  ::std::
  vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  ::~vector(&local_108);
  ::std::
  vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  ::~vector(&local_b8);
  ::std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_60);
  return;
}

Assistant:

void GridFourier::getInterpolationWeights(const double x[], double weights[]) const {
    // if Fourier coefficient are c, Data from the target function is f, and values of the basis functions are b
    // then we have c = A * f (where A is both the Fourier transform and the reindexing)
    // and the value of the interpolant is result = <c, b> = <A f, b> = <f, A^* b>, where A^* is conjugate transpose
    // However, we consider only the real values (the complex ones add-up to zero), thus we really need A^T (regular transpose)
    // The Fourier transform is symmetric with respect to regular transpose, which leaves only the indexing
    // Take the basis functions, reindex and reorder to a data strucutre, take FFT, reindex and reorder into the weights
    //
    //
    // This code uses a O(N) algorithm instead of an O(N log N) FFT. On a 1D tensor with N=3^l points, we must compute the
    // Fourier transform of
    //      {x_n} = e^(2 \pi i x * {0,1,2, ..., (N-1)/2, -(N-1)/2, ..., -2, -1}).           (componentwise operations)
    // The FFT is
    //      X[m] = \sum_{j=0}^{N-1} e^{-2 \pi i j m / N} x_n
    //           = ( \sum_{j=0}^{(N-1)/2} e^{-2 \pi i j m / N} e^{2 \pi i x j} )
    //                + ( \sum_{j=1}^{(N-1)/2} e^{2 \pi i j m / N} e^{-2 \pi i x j} )
    //           = 2 * Re[ \sum_{j=0}^{(N-1)/2} e^{-2 \pi i j m / N} e^{2 \pi i x j} ] - 1
    //           = 2 * Re[ \sum_{j=0}^{(N-1)/2} (e^{2 \pi i (x-m/N)})^j ] - 1
    //           = 2 * Re[ \frac{1 - e^{2 \pi i (x-m/N) (N+1)/2}}{1 - e^{2 \pi i (x-m/N)}} ] - 1
    // The cost is mainly driven by evaluating the complex exponentials, so we compute what we can at the beginning and
    // park it in a cache.

    const MultiIndexSet &work = (points.empty()) ? needed : points;
    std::vector<std::vector<int>> index_map = generateIndexingMap();

    std::fill_n(weights, work.getNumIndexes(), 0.0);

    // compute what we need for e^{-2 \pi i m / N}
    int maxl = active_tensors.getMaxIndex() + 1;
    std::vector<std::vector<std::complex<double>>> expcache(maxl);
    for(int i=0; i<maxl; i++){
        int num_oned_points = wrapper.getNumPoints(i);
        expcache[i].resize(num_oned_points);
        expcache[i][0] = std::complex<double>(1.0, 0.0);
        double theta = -2.0 * Maths::pi / ((double) num_oned_points);       // step angle
        std::complex<double> step(std::cos(theta), std::sin(theta));
        for(int j=1; j<num_oned_points; j++) expcache[i][j] = expcache[i][j-1] * step;
    }

    // compute what we need for e^{2 \pi i x (N+1)/2}
    std::vector<std::vector<std::complex<double>>> numerator_cache(num_dimensions);
    for(int k=0; k<num_dimensions; k++){
        numerator_cache[k].resize(max_levels[k]+1);
        double theta = 2.0 * Maths::pi * x[k];
        numerator_cache[k][0] = std::complex<double>(std::cos(theta), std::sin(theta));
        for(int j=1; j<max_levels[k]+1; j++){
            numerator_cache[k][j] = numerator_cache[k][j-1];
            for(int i=0; i<wrapper.getNumPoints(j-1); i++) numerator_cache[k][j] *= numerator_cache[k][0];
        }
    }

    for(int n=0; n<active_tensors.getNumIndexes(); n++){
        const int *levels = active_tensors.getIndex(n);
        int num_tensor_points = 1;
        std::vector<int> num_oned_points(num_dimensions);
        for(int j=0; j<num_dimensions; j++){
            num_oned_points[j] = wrapper.getNumPoints(levels[j]);
            num_tensor_points *= num_oned_points[j];
        }
        std::vector<int> p(num_dimensions);

        double tensorw = ((double) active_w[n]) / ((double) num_tensor_points);
        for(int i=0; i<num_tensor_points; i++){
            // We interpret this "i" as running through the spatial indexing; convert to internal
            int t=i;
            double fftprod = 1.0;
            for(int j=num_dimensions-1; j>=0; j--){ // here p is the index of the spacial point in Tasmanian indexing
                int r = t % num_oned_points[j];
                int offset = (r*(num_oned_points[j]+1)/2) % num_oned_points[j];     // in order to fetch reduced form of (N+1)*r/(2*N)

                if (std::abs(1.0 - (numerator_cache[j][0] * expcache[levels[j]][r]).real()) <  Maths::num_tol){
                    // we're evaluating the basis functions at a node; take care of zero-divide
                    fftprod *= num_oned_points[j];
                }else{
                    fftprod *= 2.0 * ( (1.0 - numerator_cache[j][levels[j]] * expcache[levels[j]][offset])
                                / (1.0 - numerator_cache[j][0] * expcache[levels[j]][r]) ).real() - 1.0;
                }

                p[j] = index_map[levels[j]][r];
                t /= num_oned_points[j];
            }
            weights[work.getSlot(p)] += (tensorw * fftprod);
        }
    }
}